

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.hpp
# Opt level: O1

void __thiscall
Diligent::RenderPassCache::RenderPassCacheKey::RenderPassCacheKey
          (RenderPassCacheKey *this,Uint32 _NumRenderTargets,Uint32 _SampleCount,
          TEXTURE_FORMAT *_RTVFormats,TEXTURE_FORMAT _DSVFormat,bool _EnableVRS,bool _ReadOnlyDSV)

{
  byte bVar1;
  char (*Args_1) [66];
  ulong uVar2;
  string local_40;
  
  this->NumRenderTargets = (Uint8)_NumRenderTargets;
  this->SampleCount = (Uint8)_SampleCount;
  this->EnableVRS = _EnableVRS;
  this->ReadOnlyDSV = _ReadOnlyDSV;
  this->DSVFormat = _DSVFormat;
  this->RTVFormats[0] = TEX_FORMAT_UNKNOWN;
  this->RTVFormats[1] = TEX_FORMAT_UNKNOWN;
  this->RTVFormats[2] = TEX_FORMAT_UNKNOWN;
  this->RTVFormats[3] = TEX_FORMAT_UNKNOWN;
  this->RTVFormats[4] = TEX_FORMAT_UNKNOWN;
  this->RTVFormats[5] = TEX_FORMAT_UNKNOWN;
  this->RTVFormats[6] = TEX_FORMAT_UNKNOWN;
  this->RTVFormats[7] = TEX_FORMAT_UNKNOWN;
  this->Hash = 0;
  Args_1 = (char (*) [66])_RTVFormats;
  if (0xff < _NumRenderTargets) {
    FormatString<char[26],char[76]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "_NumRenderTargets <= std::numeric_limits<decltype(NumRenderTargets)>::max()",
               (char (*) [76])_RTVFormats);
    Args_1 = (char (*) [66])0x51;
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"RenderPassCacheKey",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/RenderPassCache.hpp"
               ,0x51);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (0xff < _SampleCount) {
    FormatString<char[26],char[66]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"_SampleCount <= std::numeric_limits<decltype(SampleCount)>::max()",
               Args_1);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"RenderPassCacheKey",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/RenderPassCache.hpp"
               ,0x52);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = this->NumRenderTargets;
  if ((ulong)bVar1 != 0) {
    uVar2 = 0;
    do {
      this->RTVFormats[uVar2] = _RTVFormats[uVar2];
      uVar2 = uVar2 + 1;
    } while (bVar1 != uVar2);
  }
  return;
}

Assistant:

RenderPassCacheKey(Uint32               _NumRenderTargets,
                           Uint32               _SampleCount,
                           const TEXTURE_FORMAT _RTVFormats[],
                           TEXTURE_FORMAT       _DSVFormat,
                           bool                 _EnableVRS,
                           bool                 _ReadOnlyDSV) :
            // clang-format off
            NumRenderTargets{static_cast<decltype(NumRenderTargets)>(_NumRenderTargets)},
            SampleCount     {static_cast<decltype(SampleCount)>     (_SampleCount)     },
            EnableVRS       {_EnableVRS                                                },
            ReadOnlyDSV     {_ReadOnlyDSV                                              },
            DSVFormat       {_DSVFormat                                                }
        // clang-format on
        {
            VERIFY_EXPR(_NumRenderTargets <= std::numeric_limits<decltype(NumRenderTargets)>::max());
            VERIFY_EXPR(_SampleCount <= std::numeric_limits<decltype(SampleCount)>::max());
            for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
                RTVFormats[rt] = _RTVFormats[rt];
        }